

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O0

boolean read_scan_script(j_compress_ptr cinfo,char *filename)

{
  boolean bVar1;
  FILE *__stream;
  void *__dest;
  char *in_RSI;
  long in_RDI;
  jpeg_scan_info scans [100];
  jpeg_scan_info *scanptr;
  long val;
  int termchar;
  int ncomps;
  int scanno;
  FILE *fp;
  int *in_stack_fffffffffffff1a8;
  long *in_stack_fffffffffffff1b0;
  FILE *in_stack_fffffffffffff1b8;
  int *local_40;
  int local_38;
  int local_2c;
  int local_28;
  int local_24;
  boolean local_4;
  
  local_40 = (int *)&stack0xfffffffffffff1a8;
  __stream = fopen(in_RSI,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Can\'t open scan definition file %s\n",in_RSI);
    local_4 = 0;
  }
  else {
    local_24 = 0;
    while (bVar1 = read_scan_integer(in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                                     in_stack_fffffffffffff1a8), bVar1 != 0) {
      if (99 < local_24) {
        fprintf(_stderr,"Too many scans defined in file %s\n",in_RSI);
        fclose(__stream);
        return 0;
      }
      local_40[1] = local_38;
      local_28 = 1;
      while (local_2c == 0x20) {
        if (3 < local_28) {
          fprintf(_stderr,"Too many components in one scan in file %s\n",in_RSI);
          fclose(__stream);
          return 0;
        }
        bVar1 = read_scan_integer(in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                                  in_stack_fffffffffffff1a8);
        if (bVar1 == 0) goto LAB_0010b68a;
        local_40[(long)local_28 + 1] = local_38;
        local_28 = local_28 + 1;
      }
      *local_40 = local_28;
      if (local_2c == 0x3a) {
        read_scan_integer(in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
                          in_stack_fffffffffffff1a8);
LAB_0010b68a:
        fprintf(_stderr,"Invalid scan entry format in file %s\n",in_RSI);
        fclose(__stream);
        return 0;
      }
      local_40[5] = 0;
      local_40[6] = 0x3f;
      local_40[7] = 0;
      local_40[8] = 0;
      if ((local_2c != 0x3b) && (local_2c != -1)) goto LAB_0010b68a;
      local_40 = local_40 + 9;
      local_24 = local_24 + 1;
    }
    if (local_2c == -1) {
      if (0 < local_24) {
        __dest = (void *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,(long)local_24 * 0x24);
        memcpy(__dest,&stack0xfffffffffffff1a8,(long)local_24 * 0x24);
        *(void **)(in_RDI + 0xf8) = __dest;
        *(int *)(in_RDI + 0xf0) = local_24;
      }
      fclose(__stream);
      local_4 = 1;
    }
    else {
      fprintf(_stderr,"Non-numeric data in file %s\n",in_RSI);
      fclose(__stream);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

GLOBAL(boolean)
read_scan_script(j_compress_ptr cinfo, char *filename)
/* Read a scan script from the specified text file.
 * Each entry in the file defines one scan to be emitted.
 * Entries are separated by semicolons ';'.
 * An entry contains one to four component indexes,
 * optionally followed by a colon ':' and four progressive-JPEG parameters.
 * The component indexes denote which component(s) are to be transmitted
 * in the current scan.  The first component has index 0.
 * Sequential JPEG is used if the progressive-JPEG parameters are omitted.
 * The file is free format text: any whitespace may appear between numbers
 * and the ':' and ';' punctuation marks.  Also, other punctuation (such
 * as commas or dashes) can be placed between numbers if desired.
 * Comments preceded by '#' may be included in the file.
 * Note: we do very little validity checking here;
 * jcmaster.c will validate the script parameters.
 */
{
  FILE *fp;
  int scanno, ncomps, termchar;
  long val;
  jpeg_scan_info *scanptr;
#define MAX_SCANS  100          /* quite arbitrary limit */
  jpeg_scan_info scans[MAX_SCANS];

  if ((fp = fopen(filename, "r")) == NULL) {
    fprintf(stderr, "Can't open scan definition file %s\n", filename);
    return FALSE;
  }
  scanptr = scans;
  scanno = 0;

  while (read_scan_integer(fp, &val, &termchar)) {
    if (scanno >= MAX_SCANS) {
      fprintf(stderr, "Too many scans defined in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    scanptr->component_index[0] = (int)val;
    ncomps = 1;
    while (termchar == ' ') {
      if (ncomps >= MAX_COMPS_IN_SCAN) {
        fprintf(stderr, "Too many components in one scan in file %s\n",
                filename);
        fclose(fp);
        return FALSE;
      }
      if (!read_scan_integer(fp, &val, &termchar))
        goto bogus;
      scanptr->component_index[ncomps] = (int)val;
      ncomps++;
    }
    scanptr->comps_in_scan = ncomps;
    if (termchar == ':') {
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Ss = (int)val;
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Se = (int)val;
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Ah = (int)val;
      if (!read_scan_integer(fp, &val, &termchar))
        goto bogus;
      scanptr->Al = (int)val;
    } else {
      /* set non-progressive parameters */
      scanptr->Ss = 0;
      scanptr->Se = DCTSIZE2 - 1;
      scanptr->Ah = 0;
      scanptr->Al = 0;
    }
    if (termchar != ';' && termchar != EOF) {
bogus:
      fprintf(stderr, "Invalid scan entry format in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    scanptr++, scanno++;
  }

  if (termchar != EOF) {
    fprintf(stderr, "Non-numeric data in file %s\n", filename);
    fclose(fp);
    return FALSE;
  }

  if (scanno > 0) {
    /* Stash completed scan list in cinfo structure.
     * NOTE: for cjpeg's use, JPOOL_IMAGE is the right lifetime for this data,
     * but if you want to compress multiple images you'd want JPOOL_PERMANENT.
     */
    scanptr = (jpeg_scan_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  scanno * sizeof(jpeg_scan_info));
    MEMCOPY(scanptr, scans, scanno * sizeof(jpeg_scan_info));
    cinfo->scan_info = scanptr;
    cinfo->num_scans = scanno;
  }

  fclose(fp);
  return TRUE;
}